

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  uint uVar2;
  mfb_update_state state;
  int i;
  mfb_window *in_stack_00000038;
  Events e;
  mfb_window *window;
  int seed;
  int carry;
  int noise;
  uint in_stack_000000fc;
  uint in_stack_00000100;
  uint in_stack_00000104;
  char *in_stack_00000108;
  undefined1 *buffer;
  mfb_update_state in_stack_ffffffffffffff68;
  int iVar3;
  offset_in_Events_to_subr in_stack_ffffffffffffff78;
  Events *in_stack_ffffffffffffff88;
  Events *obj;
  mfb_window *in_stack_ffffffffffffff90;
  code *window_00;
  undefined1 local_19;
  mfb_window *local_18;
  uint local_10;
  uint local_c;
  uint local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = 0xbeef;
  local_18 = mfb_open_ex(in_stack_00000108,in_stack_00000104,in_stack_00000100,in_stack_000000fc);
  if (local_18 != (mfb_window *)0x0) {
    buffer = &local_19;
    mfb_set_active_callback<Events>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
    mfb_set_resize_callback<Events>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
    mfb_set_keyboard_callback<Events>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
    mfb_set_char_input_callback<Events>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
    window_00 = Events::mouse_btn;
    mfb_set_mouse_button_callback<Events>
              ((mfb_window *)Events::mouse_btn,in_stack_ffffffffffffff88,in_stack_ffffffffffffff78);
    obj = (Events *)0x0;
    mfb_set_mouse_move_callback<Events>
              ((mfb_window *)window_00,(Events *)0x0,in_stack_ffffffffffffff78);
    mfb_set_mouse_scroll_callback<Events>((mfb_window *)window_00,obj,0);
    mfb_set_user_data(local_18,"Input Events CPP Test");
    do {
      for (iVar3 = 0; iVar3 < 480000; iVar3 = iVar3 + 1) {
        uVar2 = local_10 ^ (int)local_10 >> 3;
        local_c = uVar2 & 1;
        local_10 = local_c << 0x1e | (int)local_10 >> 1;
        local_8 = (int)uVar2 >> 1 & 0xff;
        g_buffer[iVar3] = local_8 << 0x10 | local_8 << 8 | local_8;
      }
      in_stack_ffffffffffffff68 =
           mfb_update((mfb_window *)CONCAT44(iVar3,in_stack_ffffffffffffff68),buffer);
    } while ((in_stack_ffffffffffffff68 == STATE_OK) &&
            (_Var1 = mfb_wait_sync(in_stack_00000038), _Var1));
  }
  return 0;
}

Assistant:

int 
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("Input Events CPP Test", WIDTH, HEIGHT, WF_RESIZABLE);
    if (!window)
        return 0;

    Events e;

    mfb_set_active_callback(window, &e, &Events::active);
    mfb_set_resize_callback(window, &e, &Events::resize);
    mfb_set_keyboard_callback(window, &e, &Events::keyboard);
    mfb_set_char_input_callback(window, &e, &Events::char_input);
    mfb_set_mouse_button_callback(window, &e, &Events::mouse_btn);
    mfb_set_mouse_move_callback(window, &e, &Events::mouse_move);
    mfb_set_mouse_scroll_callback(window, &e, &Events::mouse_scroll);

    mfb_set_user_data(window, (void *) "Input Events CPP Test");

    do {
        int         i;
        mfb_update_state state;

        for (i = 0; i < WIDTH * HEIGHT; ++i) {
            noise = seed;
            noise >>= 3;
            noise ^= seed;
            carry = noise & 1;
            noise >>= 1;
            seed >>= 1;
            seed |= (carry << 30);
            noise &= 0xFF;
            g_buffer[i] = MFB_RGB(noise, noise, noise); 
        }

        state = mfb_update(window, g_buffer);
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}